

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecPat.c
# Opt level: O3

Vec_Ptr_t * Cec_ManPatCollectPatterns(Cec_ManPat_t *pMan,int nInputs,int nWordsInit)

{
  int iVar1;
  char cVar2;
  Vec_Int_t *p;
  char *pcVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void **ppvVar7;
  void **ppvVar8;
  Vec_Ptr_t *vInfo;
  byte bVar9;
  void **ppvVar10;
  Vec_Str_t *pVVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  Vec_Ptr_t *vPres;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  size_t sVar25;
  int i;
  long lVar26;
  long lVar27;
  timespec ts;
  uint local_b0;
  uint local_ac;
  timespec local_98;
  ulong local_88;
  ulong local_80;
  void **local_78;
  ulong local_70;
  Vec_Ptr_t *local_68;
  int local_5c;
  uint local_58;
  uint local_54;
  long local_50;
  long local_48;
  ulong local_40;
  long local_38;
  
  p = pMan->vPattern1;
  iVar6 = pMan->iStart;
  iVar4 = clock_gettime(3,&local_98);
  if (iVar4 < 0) {
    local_50 = -1;
  }
  else {
    local_50 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
  }
  lVar24 = (long)nWordsInit;
  lVar26 = (long)nInputs;
  sVar25 = (lVar24 * 4 + 8) * lVar26;
  local_88 = (ulong)(uint)nWordsInit;
  local_5c = iVar6;
  ppvVar7 = (void **)malloc(sVar25);
  local_80 = (ulong)(uint)nInputs;
  if (0 < nInputs) {
    ppvVar8 = ppvVar7 + lVar26;
    ppvVar10 = ppvVar7;
    uVar18 = local_80;
    do {
      *ppvVar10 = ppvVar8;
      ppvVar10 = ppvVar10 + 1;
      ppvVar8 = (void **)((long)ppvVar8 + lVar24 * 4);
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
  }
  vInfo = (Vec_Ptr_t *)malloc(0x10);
  vInfo->nSize = nInputs;
  vInfo->nCap = nInputs;
  vInfo->pArray = ppvVar7;
  local_48 = lVar26;
  Gia_ManRandomInfo(vInfo,0,0,(int)local_88);
  ppvVar7 = (void **)malloc(sVar25);
  lVar26 = local_48;
  if (0 < nInputs) {
    ppvVar8 = ppvVar7 + local_48;
    ppvVar10 = ppvVar7;
    uVar18 = local_80;
    do {
      *ppvVar10 = ppvVar8;
      ppvVar10 = ppvVar10 + 1;
      ppvVar8 = (void **)((long)ppvVar8 + lVar24 * 4);
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
  }
  local_68 = (Vec_Ptr_t *)malloc(0x10);
  local_68->nSize = nInputs;
  local_68->nCap = nInputs;
  local_68->pArray = ppvVar7;
  if (0 < nInputs) {
    iVar6 = (int)local_88;
    lVar24 = 0;
    do {
      memset(ppvVar7[lVar24],0,(long)(iVar6 * 4));
      lVar24 = lVar24 + 1;
    } while (lVar26 != lVar24);
  }
  uVar23 = (int)local_88 << 5;
  iVar6 = pMan->iStart;
  pVVar11 = pMan->vStorage;
  iVar4 = pVVar11->nSize;
  if (iVar6 < iVar4) {
    local_38 = local_80 * 8;
    local_ac = 0;
    local_b0 = 0xffffffff;
    uVar18 = (ulong)uVar23;
    local_70 = local_88;
    local_78 = ppvVar7;
    local_58 = uVar23;
    do {
      p->nSize = 0;
      iVar1 = iVar6 + 1;
      pMan->iStart = iVar1;
      if ((iVar6 < 0) || (iVar4 == iVar6)) {
LAB_009067a3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      local_ac = local_ac + 1;
      pcVar3 = pVVar11->pArray;
      iVar5 = iVar6 + 3;
      bVar9 = 0;
      iVar20 = 0;
      uVar16 = 0;
      iVar14 = iVar1;
      while (cVar2 = pcVar3[(uint)(iVar6 + iVar20)], cVar2 < '\0') {
        uVar16 = uVar16 | ((int)cVar2 & 0x7fU) << (bVar9 & 0x1f);
        pMan->iStart = iVar6 + iVar20 + 2;
        iVar20 = iVar20 + 1;
        bVar9 = bVar9 + 7;
        iVar14 = iVar14 + 1;
        iVar5 = iVar5 + 1;
        if ((iVar6 - iVar4) + iVar20 == 0) goto LAB_009067a3;
      }
      uVar22 = iVar6 + iVar20 + 2;
      pMan->iStart = uVar22;
      local_40 = uVar18;
      if (iVar6 + iVar20 + 1 < 0) goto LAB_009067a3;
      uVar16 = (int)cVar2 << (bVar9 & 0x1f) | uVar16;
      if (iVar14 < iVar4) {
        iVar14 = iVar4;
      }
      bVar9 = 0;
      uVar17 = 0;
      uVar15 = iVar1 + iVar20;
      uVar21 = uVar22;
      while( true ) {
        if (iVar5 - iVar14 == 2) goto LAB_009067a3;
        cVar2 = pcVar3[uVar15];
        if (-1 < cVar2) break;
        uVar17 = uVar17 | ((int)cVar2 & 0x7fU) << (bVar9 & 0x1f);
        pMan->iStart = iVar5;
        iVar5 = iVar5 + 1;
        bVar9 = bVar9 + 7;
        uVar15 = uVar21;
        uVar21 = uVar21 + 1;
        if ((int)uVar22 < 0) goto LAB_009067a3;
      }
      uVar17 = (int)cVar2 << (bVar9 & 0x1f) | uVar17;
      Vec_IntPush(p,uVar17);
      if (1 < (int)uVar16) {
        uVar22 = 1;
        do {
          uVar15 = pMan->iStart;
          iVar6 = uVar15 + 1;
          pMan->iStart = iVar6;
          if ((int)uVar15 < 0) goto LAB_009067a3;
          uVar21 = pMan->vStorage->nSize;
          if ((int)uVar21 < (int)uVar15) {
            uVar21 = uVar15;
          }
          bVar9 = 0;
          uVar19 = 0;
          while( true ) {
            if (uVar21 == uVar15) goto LAB_009067a3;
            cVar2 = pMan->vStorage->pArray[uVar15];
            if (-1 < cVar2) break;
            uVar19 = uVar19 | ((int)cVar2 & 0x7fU) << (bVar9 & 0x1f);
            iVar4 = uVar15 + 2;
            uVar15 = uVar15 + 1;
            bVar9 = bVar9 + 7;
            pMan->iStart = iVar4;
            if (iVar6 < 0) goto LAB_009067a3;
          }
          uVar17 = uVar17 + ((int)cVar2 << (bVar9 & 0x1f) | uVar19);
          Vec_IntPush(p,uVar17);
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar16);
      }
      uVar18 = local_40;
      vPres = local_68;
      if (p->nSize != uVar16) {
        __assert_fail("Vec_IntSize(vPat) == Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecPat.c"
                      ,0x7d,"void Cec_ManPatRestore(Cec_ManPat_t *, Vec_Int_t *)");
      }
      uVar16 = 1;
      iVar6 = (int)local_40;
      if (1 < iVar6) {
        uVar16 = 1;
        do {
          iVar4 = Cec_ManPatCollectTry(vInfo,vPres,uVar16,p->pArray,p->nSize);
          if (iVar4 != 0) break;
          uVar16 = uVar16 + 1 + (uint)((int)(uVar16 + 1) % (int)uVar23 == 0);
        } while ((int)uVar16 < iVar6);
      }
      if ((int)local_b0 <= (int)uVar16) {
        local_b0 = uVar16;
      }
      if (uVar16 == iVar6 - 1U) {
        lVar24 = (long)vInfo->nSize;
        if (lVar24 < 2) {
LAB_00906800:
          __assert_fail("Vec_PtrSize(vInfo) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x456,"void Vec_PtrReallocSimInfo(Vec_Ptr_t *)");
        }
        iVar6 = (int)((ulong)((long)vInfo->pArray[1] - (long)*vInfo->pArray) >> 2);
        lVar27 = (long)(iVar6 * 2);
        ppvVar7 = (void **)malloc((lVar27 * 4 + 8) * lVar24);
        lVar26 = lVar24 * 8;
        lVar12 = 0;
        do {
          ppvVar7[lVar12] = (void *)((long)ppvVar7 + lVar26);
          lVar12 = lVar12 + 1;
          lVar26 = lVar26 + lVar27 * 4;
        } while (lVar24 != lVar12);
        lVar26 = 0;
        do {
          if (lVar24 == lVar26) goto LAB_009067c2;
          memcpy(ppvVar7[lVar26],vInfo->pArray[lVar26],(long)(iVar6 << 2));
          lVar26 = lVar26 + 1;
        } while (lVar26 < vInfo->nSize);
        if (vInfo->pArray != (void **)0x0) {
          free(vInfo->pArray);
        }
        vInfo->pArray = ppvVar7;
        local_54 = (int)local_70 * 2;
        Gia_ManRandomInfo(vInfo,0,(int)local_70,local_54);
        uVar18 = local_80;
        if (nInputs < 2) goto LAB_00906800;
        iVar6 = (int)((ulong)((long)local_78[1] - (long)*local_78) >> 2);
        lVar12 = (long)(iVar6 * 2);
        ppvVar8 = (void **)malloc((lVar12 * 4 + 8) * local_80);
        lVar24 = local_48;
        ppvVar7 = local_78;
        uVar13 = 0;
        lVar26 = local_38;
        do {
          ppvVar8[uVar13] = (void *)((long)ppvVar8 + lVar26);
          uVar13 = uVar13 + 1;
          lVar26 = lVar26 + lVar12 * 4;
        } while (uVar18 != uVar13);
        lVar26 = 0;
        do {
          memcpy(ppvVar8[lVar26],ppvVar7[lVar26],(long)(iVar6 << 2));
          lVar26 = lVar26 + 1;
        } while (lVar24 != lVar26);
        free(ppvVar7);
        vPres = local_68;
        local_68->pArray = ppvVar8;
        sVar25 = (size_t)((int)local_70 << 2);
        lVar26 = 0;
        do {
          memset((void *)((long)ppvVar8[lVar26] + sVar25),0,sVar25);
          lVar26 = lVar26 + 1;
        } while (lVar24 != lVar26);
        uVar18 = (ulong)(uint)((int)local_40 * 2);
        local_70 = (ulong)local_54;
        uVar23 = local_58;
        local_78 = ppvVar8;
      }
      else {
        local_70 = local_70 & 0xffffffff;
      }
      iVar6 = pMan->iStart;
      pVVar11 = pMan->vStorage;
      iVar4 = pVVar11->nSize;
      ppvVar7 = local_78;
    } while (iVar6 < iVar4);
  }
  else {
    local_b0 = 0xffffffff;
    local_ac = 0;
    vPres = local_68;
  }
  if (ppvVar7 != (void **)0x0) {
    free(ppvVar7);
  }
  free(vPres);
  lVar24 = local_50;
  if (1 < vInfo->nSize) {
    uVar18 = (ulong)((long)vInfo->pArray[1] - (long)*vInfo->pArray) >> 2;
    pMan->nSeries =
         (int)((long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) /
              (long)(int)local_88);
    iVar6 = clock_gettime(3,&local_98);
    lVar12 = -1;
    lVar26 = -1;
    if (-1 < iVar6) {
      lVar26 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
    }
    pMan->timePack = pMan->timePack + (lVar26 - lVar24);
    iVar4 = 3;
    iVar6 = clock_gettime(3,&local_98);
    if (-1 < iVar6) {
      lVar12 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
    }
    pMan->timeTotal = pMan->timeTotal + (lVar12 - lVar24);
    pMan->iStart = local_5c;
    if (pMan->fVerbose != 0) {
      Abc_Print(iVar4,"Total = %5d. Max used = %5d. Full = %5d. Series = %d. ",(ulong)local_ac,
                (ulong)local_b0,(ulong)uVar23,(ulong)(uint)pMan->nSeries);
      Abc_Print(iVar4,"%s =","Time");
      iVar4 = 3;
      iVar6 = clock_gettime(3,&local_98);
      if (iVar6 < 0) {
        lVar26 = -1;
      }
      else {
        lVar26 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
      }
      Abc_Print(iVar4,"%9.2f sec\n",(double)(lVar26 - lVar24) / 1000000.0);
      Cec_ManPatPrintStats(pMan);
    }
    return vInfo;
  }
LAB_009067c2:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Vec_Ptr_t * Cec_ManPatCollectPatterns( Cec_ManPat_t *  pMan, int nInputs, int nWordsInit )
{
    Vec_Int_t * vPat = pMan->vPattern1;
    Vec_Ptr_t * vInfo, * vPres;
    int k, kMax = -1, nPatterns = 0;
    int iStartOld = pMan->iStart;
    int nWords = nWordsInit;
    int nBits = 32 * nWords;
    abctime clk = Abc_Clock();
    vInfo = Vec_PtrAllocSimInfo( nInputs, nWords );
    Gia_ManRandomInfo( vInfo, 0, 0, nWords );
    vPres = Vec_PtrAllocSimInfo( nInputs, nWords );
    Vec_PtrCleanSimInfo( vPres, 0, nWords );
    while ( pMan->iStart < Vec_StrSize(pMan->vStorage) )
    {
        nPatterns++;
        Cec_ManPatRestore( pMan, vPat );
        for ( k = 1; k < nBits; k++, k += ((k % (32 * nWordsInit)) == 0) )
            if ( Cec_ManPatCollectTry( vInfo, vPres, k, (int *)Vec_IntArray(vPat), Vec_IntSize(vPat) ) )
                break;
        kMax = Abc_MaxInt( kMax, k );
        if ( k == nBits-1 )
        {
            Vec_PtrReallocSimInfo( vInfo );
            Gia_ManRandomInfo( vInfo, 0, nWords, 2*nWords );
            Vec_PtrReallocSimInfo( vPres );
            Vec_PtrCleanSimInfo( vPres, nWords, 2*nWords );
            nWords *= 2;
            nBits *= 2;
        }
    }
    Vec_PtrFree( vPres );
    pMan->nSeries = Vec_PtrReadWordsSimInfo(vInfo) / nWordsInit;
    pMan->timePack += Abc_Clock() - clk;
    pMan->timeTotal += Abc_Clock() - clk;
    pMan->iStart = iStartOld;
    if ( pMan->fVerbose )
    {
        Abc_Print( 1, "Total = %5d. Max used = %5d. Full = %5d. Series = %d. ", 
            nPatterns, kMax, nWordsInit*32, pMan->nSeries );
        ABC_PRT( "Time", Abc_Clock() - clk );
        Cec_ManPatPrintStats( pMan );
    }
    return vInfo;
}